

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswUnique.c
# Opt level: O0

void Ssw_UniqueRegisterPairInfo(Ssw_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int Counter;
  int RetValue;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *pObjLo;
  Ssw_Man_t *p_local;
  
  if (p->vDiffPairs == (Vec_Int_t *)0x0) {
    iVar1 = Saig_ManRegNum(p->pAig);
    pVVar3 = Vec_IntAlloc(iVar1);
    p->vDiffPairs = pVVar3;
  }
  Vec_IntClear(p->vDiffPairs);
  for (Counter = 0; iVar1 = Saig_ManRegNum(p->pAig), Counter < iVar1; Counter = Counter + 1) {
    p_00 = p->pAig->vCis;
    iVar1 = Saig_ManPiNum(p->pAig);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,Counter + iVar1);
    pAVar5 = Ssw_ObjFrame(p,pAVar4,0);
    pAVar4 = Ssw_ObjFrame(p,pAVar4,1);
    if (pAVar5 == pAVar4) {
      Vec_IntPush(p->vDiffPairs,0);
    }
    else {
      pAVar6 = Aig_Not(pAVar4);
      if (pAVar5 == pAVar6) {
        Vec_IntPush(p->vDiffPairs,1);
      }
      else {
        iVar1 = Aig_ObjPhaseReal(pAVar5);
        iVar2 = Aig_ObjPhaseReal(pAVar4);
        if (iVar1 == iVar2) {
          pAVar5 = Aig_Regular(pAVar5);
          pAVar4 = Aig_Regular(pAVar4);
          iVar1 = Ssw_NodesAreEquiv(p,pAVar5,pAVar4);
          Vec_IntPush(p->vDiffPairs,(uint)(iVar1 != 1));
        }
        else {
          Vec_IntPush(p->vDiffPairs,1);
        }
      }
    }
  }
  iVar1 = Vec_IntSize(p->vDiffPairs);
  iVar2 = Saig_ManRegNum(p->pAig);
  if (iVar1 == iVar2) {
    for (Counter = 0; iVar1 = Vec_IntSize(p->vDiffPairs), Counter < iVar1; Counter = Counter + 1) {
      Vec_IntEntry(p->vDiffPairs,Counter);
    }
    return;
  }
  __assert_fail("Vec_IntSize(p->vDiffPairs) == Saig_ManRegNum(p->pAig)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswUnique.c"
                ,0x46,"void Ssw_UniqueRegisterPairInfo(Ssw_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs computation of signal correspondence with constraints.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_UniqueRegisterPairInfo( Ssw_Man_t * p )
{
    Aig_Obj_t * pObjLo, * pObj0, * pObj1;
    int i, RetValue, Counter;
    if ( p->vDiffPairs == NULL )
        p->vDiffPairs = Vec_IntAlloc( Saig_ManRegNum(p->pAig) );
    Vec_IntClear( p->vDiffPairs );
    Saig_ManForEachLo( p->pAig, pObjLo, i )
    {
        pObj0 = Ssw_ObjFrame( p, pObjLo, 0 );
        pObj1 = Ssw_ObjFrame( p, pObjLo, 1 );
        if ( pObj0 == pObj1 )
            Vec_IntPush( p->vDiffPairs, 0 );
        else if ( pObj0 == Aig_Not(pObj1) )
            Vec_IntPush( p->vDiffPairs, 1 );
//        else
//            Vec_IntPush( p->vDiffPairs, 1 );
        else if ( Aig_ObjPhaseReal(pObj0) != Aig_ObjPhaseReal(pObj1) )
            Vec_IntPush( p->vDiffPairs, 1 );
        else
        {
            RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObj0), Aig_Regular(pObj1) );
            Vec_IntPush( p->vDiffPairs, RetValue!=1 );
        }
    }
    assert( Vec_IntSize(p->vDiffPairs) == Saig_ManRegNum(p->pAig) );
    // count the number of ones
    Counter = 0;
    Vec_IntForEachEntry( p->vDiffPairs, RetValue, i )
        Counter += RetValue;
//    Abc_Print( 1, "The number of different register pairs = %d.\n", Counter );
}